

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvawatch.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  long lVar3;
  code *pcVar4;
  uint uVar5;
  int *piVar6;
  __start_routine *__start_routine;
  uint64_t uVar7;
  char *pcVar8;
  uint32_t uVar9;
  pthread_t thr;
  pthread_t pStack_38;
  
  iVar1 = nva_init();
  if (iVar1 == 0) {
    iVar1 = 0;
    do {
      while( true ) {
        iVar2 = getopt(argc,argv,"tc:m:");
        if (iVar2 < 0x6d) break;
        if (iVar2 == 0x6d) {
          pcVar8 = "%x";
          piVar6 = (int *)&mask;
LAB_00102872:
          __isoc99_sscanf(_optarg,pcVar8,piVar6);
        }
        else if (iVar2 == 0x74) {
          iVar1 = 2 - (uint)(iVar1 == 0);
        }
      }
      if (iVar2 == 99) {
        pcVar8 = "%d";
        piVar6 = &cnum;
        goto LAB_00102872;
      }
    } while (iVar2 != -1);
    if (cnum < nva_cardsnum) {
      if (_optind < argc) {
        __isoc99_sscanf(argv[_optind],"%x",&a);
        pcVar4 = t64watchfun;
        if (iVar1 == 1) {
          pcVar4 = twatchfun;
        }
        __start_routine = watchfun;
        if (iVar1 != 0) {
          __start_routine = pcVar4;
        }
        pthread_create(&pStack_38,(pthread_attr_t *)0x0,__start_routine,(void *)0x0);
        uVar9 = 0;
        uVar7 = 0;
        do {
          while (get == put) {
            sched_yield();
          }
          lVar3 = (long)get;
          if (iVar1 == 0) {
            printf("%08x\n",(ulong)queue[lVar3]);
          }
          else if (iVar1 == 1) {
            printf("%08x[+%d]: %08x\n",(ulong)tqueue[lVar3],(ulong)(tqueue[get] - uVar9),
                   (ulong)queue[get]);
            uVar9 = tqueue[get];
          }
          else {
            printf("%016lu[+%lu]: %08x\n",tqueue64[lVar3],tqueue64[get] - uVar7,(ulong)queue[get]);
            uVar7 = tqueue64[get];
          }
          uVar5 = get + 0x100000;
          if (-1 < (int)(get + 1U)) {
            uVar5 = get + 1U;
          }
          get = (get - (uVar5 & 0xfff00000)) + 1;
        } while( true );
      }
      main_cold_4();
    }
    else if (nva_cardsnum == 0) {
      main_cold_3();
    }
    else {
      main_cold_2();
    }
  }
  else {
    main_cold_1();
  }
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	unsigned int wanttime = 0;
	while ((c = getopt (argc, argv, "tc:m:")) != -1)
		switch (c) {
			case 't':
				wanttime++;
				if (wanttime > 2)
					wanttime = 2;
				break;
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
			case 'm':
				sscanf(optarg, "%x", &mask);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);

	pthread_t thr;
	if (wanttime == 0)
		pthread_create(&thr, 0, watchfun, 0);
	else if (wanttime == 1)
		pthread_create(&thr, 0, twatchfun, 0);
	else
		pthread_create(&thr, 0, t64watchfun, 0);

	uint32_t ptime = 0;
	uint64_t ptime64 = 0;
	while (1) {
		while (get == put)
			sched_yield();

		if (wanttime == 0)
			printf("%08x\n", queue[get]);
		else if (wanttime == 1) {
			printf("%08x[+%d]: %08x\n", tqueue[get], tqueue[get]-ptime, queue[get]);
			ptime = tqueue[get];
		} else {
			printf("%016"PRIu64"[+%"PRIu64"]: %08x\n", tqueue64[get], tqueue64[get]-ptime64, queue[get]);
			ptime64 = tqueue64[get];
		}

		get = (get + 1) % SZ;
	}
}